

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.h
# Opt level: O3

void __thiscall
DifferenceFormatter::Ser<VectorWriter,unsigned_short>
          (DifferenceFormatter *this,VectorWriter *s,unsigned_short v)

{
  long lVar1;
  char *pcVar2;
  undefined6 in_register_00000012;
  ulong uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = CONCAT62(in_register_00000012,v) & 0xffffffff;
  if (uVar3 < this->m_shift) {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,(error_code *)"differential value overflow");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    WriteCompactSize<VectorWriter>(s,uVar3 - this->m_shift);
    this->m_shift = uVar3 + 1;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, I v)
    {
        if (v < m_shift || v >= std::numeric_limits<uint64_t>::max()) throw std::ios_base::failure("differential value overflow");
        WriteCompactSize(s, v - m_shift);
        m_shift = uint64_t(v) + 1;
    }